

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void __thiscall
ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate
          (Array<ConvexDecomposition::ConvexH::HalfEdge> *this,int s)

{
  HalfEdge *__ptr;
  int i;
  HalfEdge *pHVar1;
  long lVar2;
  int iVar3;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  iVar3 = this->count;
  if (iVar3 <= s) {
    __ptr = this->element;
    this->array_size = s;
    pHVar1 = (HalfEdge *)malloc((ulong)(uint)s << 2);
    this->element = pHVar1;
    if (pHVar1 != (HalfEdge *)0x0) {
      for (lVar2 = 0; lVar2 < iVar3; lVar2 = lVar2 + 1) {
        this->element[lVar2] = __ptr[lVar2];
        iVar3 = this->count;
      }
      free(__ptr);
      return;
    }
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  __assert_fail("s>=count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5c0,
                "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
               );
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}